

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.hpp
# Opt level: O3

void __thiscall
tcmalloc::CentralFreelist::ReleaseToSpans(CentralFreelist *this,FreeList *freelist,int N)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  void ***pppvVar4;
  void **ppvVar5;
  Span *pSVar6;
  Span *pSVar7;
  bool bVar8;
  PageHeap *pPVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  Span *span;
  
  uVar10 = freelist->free_count_;
  if (uVar10 != 0) {
    do {
      puVar3 = (undefined8 *)freelist->head_;
      freelist->head_ = (void *)*puVar3;
      freelist->free_count_ = uVar10 - 1;
      pPVar9 = PageHeap::Instance();
      pppvVar4 = (pPVar9->page_map_).roots[(ulong)puVar3 >> 0x37];
      if ((pppvVar4 == (void ***)0x0) ||
         (ppvVar5 = pppvVar4[(uint)((ulong)puVar3 >> 0x21) & 0x3fffff], ppvVar5 == (void **)0x0)) {
        span = (Span *)0x0;
      }
      else {
        span = (Span *)ppvVar5[(uint)((ulong)puVar3 >> 0xd) & 0xfffff];
      }
      if (span->location != 0) {
        __assert_fail("span->location == Span::IN_USE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                      ,0x77,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
      }
      if (span->size_class != (long)this->class_) {
        __assert_fail("span->size_class == class_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                      ,0x78,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
      }
      uVar10 = (span->freelist).free_count_;
      if (uVar10 == 0) {
        this->span_nums_ = this->span_nums_ - 1;
        pSVar6 = span->prev;
        pSVar7 = span->next;
        pSVar6->next = pSVar7;
        pSVar7->prev = pSVar6;
        span->prev = (Span *)0x0;
        span->next = (Span *)0x0;
        this->span_nums_ = this->span_nums_ + 1;
        span->prev = &this->nonempty_;
        pSVar6 = (this->nonempty_).next;
        span->next = pSVar6;
        pSVar6->prev = span;
        (this->nonempty_).next = span;
      }
      puVar1 = &span->refcount;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
      uVar11 = this->free_objects_ + 1;
      uVar10 = uVar10 + 1;
      this->free_objects_ = uVar11;
      *puVar3 = (span->freelist).head_;
      (span->freelist).head_ = puVar3;
      (span->freelist).free_count_ = uVar10;
      if (uVar2 == 0) {
        this->free_objects_ = uVar11 - (long)(int)uVar10;
        this->span_nums_ = this->span_nums_ - 1;
        pSVar6 = span->prev;
        pSVar7 = span->next;
        pSVar6->next = pSVar7;
        pSVar7->prev = pSVar6;
        span->prev = (Span *)0x0;
        span->next = (Span *)0x0;
        pPVar9 = PageHeap::Instance();
        PageHeap::Delete(pPVar9,span);
      }
      uVar10 = freelist->free_count_;
    } while (uVar10 != 0);
  }
  bVar8 = CheckState(this);
  if (bVar8) {
    return;
  }
  __assert_fail("CheckState()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                ,0x89,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
}

Assistant:

void ReleaseToSpans(FreeList& freelist, int N) {
        while (!freelist.Empty()) {
            void* ptr = freelist.PopFront();
            Span* span = PageHeap::Instance()->GetSpanFromPageId(Span::PageIdFromPtr(ptr));
            assert(span->location == Span::IN_USE);
            assert(span->size_class == class_);

            if (span->freelist.Empty()) {
                RemoveFromList(span);
                InsertToList(&nonempty_, span);
            }

            span->refcount--;
            free_objects_++;
            span->freelist.PushFront(ptr);

            if (span->refcount == 0) {
                free_objects_ -= span->freelist.FreeObjects();
                RemoveFromList(span);
                PageHeap::Instance()->Delete(span);
            }
        }
        assert(CheckState());
    }